

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-math.c
# Opt level: O2

PVG_FT_Fixed PVG_FT_Vector_Length(PVG_FT_Vector *vec)

{
  PVG_FT_Int PVar1;
  long lVar2;
  ulong uVar3;
  byte bVar4;
  PVG_FT_Fixed s;
  long lVar5;
  PVG_FT_Vector local_28;
  
  local_28.x = vec->x;
  local_28.y = vec->y;
  if (local_28.x == 0) {
    uVar3 = -local_28.y;
    if (0 < local_28.y) {
      uVar3 = local_28.y;
    }
  }
  else if (local_28.y == 0) {
    uVar3 = -local_28.x;
    if (0 < local_28.x) {
      uVar3 = local_28.x;
    }
  }
  else {
    PVar1 = ft_trig_prenorm(&local_28);
    ft_trig_pseudo_polarize(&local_28);
    uVar3 = -local_28.x;
    if (0 < local_28.x) {
      uVar3 = local_28.x;
    }
    lVar5 = (long)(uVar3 * 0xdbd95b16 + 0x100000000) >> 0x20;
    lVar2 = -lVar5;
    if (-1 < local_28.x) {
      lVar2 = lVar5;
    }
    bVar4 = (byte)PVar1;
    if (PVar1 < 1) {
      uVar3 = (ulong)(uint)((int)lVar2 << (-bVar4 & 0x1f));
    }
    else {
      uVar3 = lVar2 + (1 << (bVar4 - 1 & 0x1f)) >> (bVar4 & 0x3f);
    }
  }
  return uVar3;
}

Assistant:

PVG_FT_Fixed PVG_FT_Vector_Length(PVG_FT_Vector* vec)
{
    PVG_FT_Int    shift;
    PVG_FT_Vector v;

    v = *vec;

    /* handle trivial cases */
    if (v.x == 0) {
        return PVG_FT_ABS(v.y);
    } else if (v.y == 0) {
        return PVG_FT_ABS(v.x);
    }

    /* general case */
    shift = ft_trig_prenorm(&v);
    ft_trig_pseudo_polarize(&v);

    v.x = ft_trig_downscale(v.x);

    if (shift > 0) return (v.x + (1 << (shift - 1))) >> shift;

    return (PVG_FT_Fixed)((PVG_FT_UInt32)v.x << -shift);
}